

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O1

_Bool CheckCollisionLines(Vector2 startPos1,Vector2 endPos1,Vector2 startPos2,Vector2 endPos2,
                         Vector2 *collisionPoint)

{
  _Bool _Var1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  fVar8 = endPos2.x;
  fVar9 = endPos2.y;
  fVar6 = startPos2.x;
  fVar7 = startPos2.y;
  fVar4 = endPos1.x;
  fVar5 = endPos1.y;
  fVar2 = startPos1.x;
  fVar3 = startPos1.y;
  fVar11 = (fVar4 - fVar2) * (fVar9 - fVar7) - (fVar5 - fVar3) * (fVar8 - fVar6);
  if ((fVar11 != 0.0) || (NAN(fVar11))) {
    fVar12 = fVar2 * fVar5 - fVar4 * fVar3;
    fVar13 = fVar6 * fVar9 - fVar8 * fVar7;
    fVar10 = ((fVar6 - fVar8) * fVar12 - (fVar2 - fVar4) * fVar13) / fVar11;
    fVar14 = fVar4;
    if (fVar2 <= fVar4) {
      fVar14 = fVar2;
    }
    _Var1 = false;
    if (fVar14 <= fVar10) {
      fVar14 = fVar4;
      if (fVar4 <= fVar2) {
        fVar14 = fVar2;
      }
      if (fVar10 <= (float)(~-(uint)NAN(fVar2) & (uint)fVar14 | (uint)fVar4 & -(uint)NAN(fVar2))) {
        fVar2 = fVar8;
        if (fVar6 <= fVar8) {
          fVar2 = fVar6;
        }
        fVar4 = fVar8;
        if (fVar8 <= fVar6) {
          fVar4 = fVar6;
        }
        _Var1 = false;
        if (((float)(~-(uint)NAN(fVar6) & (uint)fVar2 | -(uint)NAN(fVar6) & (uint)fVar8) <= fVar10)
           && (_Var1 = false, fVar10 <= fVar4)) {
          fVar11 = ((fVar7 - fVar9) * fVar12 - fVar13 * (fVar3 - fVar5)) / fVar11;
          fVar2 = fVar5;
          if (fVar3 <= fVar5) {
            fVar2 = fVar3;
          }
          fVar4 = fVar5;
          if (fVar5 <= fVar3) {
            fVar4 = fVar3;
          }
          _Var1 = false;
          if (((float)(~-(uint)NAN(fVar3) & (uint)fVar2 | -(uint)NAN(fVar3) & (uint)fVar5) <= fVar11
              ) && (_Var1 = false, fVar11 <= fVar4)) {
            fVar2 = fVar9;
            if (fVar7 <= fVar9) {
              fVar2 = fVar7;
            }
            fVar3 = fVar9;
            if (fVar9 <= fVar7) {
              fVar3 = fVar7;
            }
            _Var1 = false;
            if ((((float)(~-(uint)NAN(fVar7) & (uint)fVar2 | -(uint)NAN(fVar7) & (uint)fVar9) <=
                  fVar11) && (_Var1 = false, fVar11 <= fVar3)) &&
               (_Var1 = true, collisionPoint != (Vector2 *)0x0)) {
              collisionPoint->x = fVar10;
              collisionPoint->y = fVar11;
              return _Var1;
            }
          }
        }
      }
    }
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool CheckCollisionLines(Vector2 startPos1, Vector2 endPos1, Vector2 startPos2, Vector2 endPos2, Vector2 *collisionPoint)
{
    const float div = (endPos2.y - startPos2.y)*(endPos1.x - startPos1.x) - (endPos2.x - startPos2.x)*(endPos1.y - startPos1.y);

    if (div == 0.0f) return false;      // WARNING: This check could not work due to float precision rounding issues...

    const float xi = ((startPos2.x - endPos2.x)*(startPos1.x*endPos1.y - startPos1.y*endPos1.x) - (startPos1.x - endPos1.x)*(startPos2.x*endPos2.y - startPos2.y*endPos2.x))/div;
    const float yi = ((startPos2.y - endPos2.y)*(startPos1.x*endPos1.y - startPos1.y*endPos1.x) - (startPos1.y - endPos1.y)*(startPos2.x*endPos2.y - startPos2.y*endPos2.x))/div;

    if (xi < fminf(startPos1.x, endPos1.x) || xi > fmaxf(startPos1.x, endPos1.x)) return false;
    if (xi < fminf(startPos2.x, endPos2.x) || xi > fmaxf(startPos2.x, endPos2.x)) return false;
    if (yi < fminf(startPos1.y, endPos1.y) || yi > fmaxf(startPos1.y, endPos1.y)) return false;
    if (yi < fminf(startPos2.y, endPos2.y) || yi > fmaxf(startPos2.y, endPos2.y)) return false;

    if (collisionPoint != 0)
    {
        collisionPoint->x = xi;
        collisionPoint->y = yi;
    }

    return true;
}